

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddBddAbs.c
# Opt level: O0

int Cudd_bddVarIsDependent(DdManager *dd,DdNode *f,DdNode *var)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  DdNode *pDVar4;
  DdNode *pDVar5;
  DdNode *pDVar6;
  bool local_65;
  uint local_64;
  int retval;
  DD_CTFP cacheOp;
  uint level;
  uint topf;
  DdNode *fe;
  DdNode *ft;
  DdNode *zero;
  DdNode *res;
  DdNode *F;
  DdNode *var_local;
  DdNode *f_local;
  DdManager *dd_local;
  
  pDVar4 = (DdNode *)((ulong)dd->one ^ 1);
  if (*(int *)((ulong)f & 0xfffffffffffffffe) == 0x7fffffff) {
    dd_local._4_4_ = (uint)(f == pDVar4);
  }
  else {
    pDVar5 = (DdNode *)((ulong)f & 0xfffffffffffffffe);
    uVar1 = dd->perm[pDVar5->index];
    uVar2 = dd->perm[var->index];
    if (uVar2 < uVar1) {
      dd_local._4_4_ = 0;
    }
    else {
      pDVar6 = cuddCacheLookup2(dd,Cudd_bddVarIsDependent,f,var);
      if (pDVar6 == (DdNode *)0x0) {
        pDVar6 = (DdNode *)((ulong)(pDVar5->type).kids.T ^ (long)(int)(uint)(f != pDVar5));
        pDVar5 = (DdNode *)((ulong)(pDVar5->type).kids.E ^ (long)(int)(uint)(f != pDVar5));
        if (uVar1 == uVar2) {
          local_64 = Cudd_bddLeq(dd,pDVar6,(DdNode *)((ulong)pDVar5 ^ 1));
        }
        else {
          iVar3 = Cudd_bddVarIsDependent(dd,pDVar6,var);
          local_65 = false;
          if (iVar3 != 0) {
            iVar3 = Cudd_bddVarIsDependent(dd,pDVar5,var);
            local_65 = iVar3 != 0;
          }
          local_64 = (uint)local_65;
        }
        cuddCacheInsert2(dd,Cudd_bddVarIsDependent,f,var,
                         (DdNode *)((ulong)pDVar4 ^ (long)(int)local_64));
        dd_local._4_4_ = local_64;
      }
      else {
        dd_local._4_4_ = (uint)(pDVar6 != pDVar4);
      }
    }
  }
  return dd_local._4_4_;
}

Assistant:

int
Cudd_bddVarIsDependent(
  DdManager *dd,                /* manager */
  DdNode *f,                    /* function */
  DdNode *var                   /* variable */)
{
    DdNode *F, *res, *zero, *ft, *fe;
    unsigned topf, level;
    DD_CTFP cacheOp;
    int retval;

    zero = Cudd_Not(DD_ONE(dd));
    if (Cudd_IsConstant(f)) return(f == zero);

    /* From now on f is not constant. */
    F = Cudd_Regular(f);
    topf = (unsigned) dd->perm[F->index];
    level = (unsigned) dd->perm[var->index];

    /* Check terminal case. If topf > index of var, f does not depend on var.
    ** Therefore, var is not dependent in f. */
    if (topf > level) {
        return(0);
    }

    cacheOp = (DD_CTFP) Cudd_bddVarIsDependent;
    res = cuddCacheLookup2(dd,cacheOp,f,var);
    if (res != NULL) {
        return(res != zero);
    }

    /* Compute cofactors. */
    ft = Cudd_NotCond(cuddT(F), f != F);
    fe = Cudd_NotCond(cuddE(F), f != F);

    if (topf == level) {
        retval = Cudd_bddLeq(dd,ft,Cudd_Not(fe));
    } else {
        retval = Cudd_bddVarIsDependent(dd,ft,var) &&
            Cudd_bddVarIsDependent(dd,fe,var);
    }

    cuddCacheInsert2(dd,cacheOp,f,var,Cudd_NotCond(zero,retval));

    return(retval);

}